

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

SslTcpSocket * SslTcpSocketImpl::SwitchToSsl(TcpSocket *pTcpSocket)

{
  SslTcpSocketImpl *pSVar1;
  pointer pBVar2;
  BaseSocketImpl *pBVar3;
  SslTcpSocketImpl *local_b8;
  SslTcpSocketImpl *local_a8;
  lock_guard<std::mutex> local_98;
  lock_guard<std::mutex> lock;
  type local_80;
  code *local_58;
  undefined8 local_50;
  type local_48;
  SslTcpSocketImpl *local_30;
  SslTcpSocketImpl *pSslTcpSocketImpl;
  SslTcpSocket *pSslTcpSock;
  unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> local_18;
  unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> pSslTcpSocket;
  TcpSocket *pTcpSocket_local;
  
  pSslTcpSocket._M_t.super___uniq_ptr_impl<BaseSocket,_std::default_delete<BaseSocket>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocket_*,_std::default_delete<BaseSocket>_>.
  super__Head_base<0UL,_BaseSocket_*,_false>._M_head_impl =
       (__uniq_ptr_data<BaseSocket,_std::default_delete<BaseSocket>,_true,_true>)
       (__uniq_ptr_data<BaseSocket,_std::default_delete<BaseSocket>,_true,_true>)pTcpSocket;
  std::make_unique<SslTcpSocket,TcpSocket*&>((TcpSocket **)&pSslTcpSock);
  std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>::
  unique_ptr<SslTcpSocket,std::default_delete<SslTcpSocket>,void>
            ((unique_ptr<BaseSocket,std::default_delete<BaseSocket>> *)&local_18,
             (unique_ptr<SslTcpSocket,_std::default_delete<SslTcpSocket>_> *)&pSslTcpSock);
  std::unique_ptr<SslTcpSocket,_std::default_delete<SslTcpSocket>_>::~unique_ptr
            ((unique_ptr<SslTcpSocket,_std::default_delete<SslTcpSocket>_> *)&pSslTcpSock);
  pBVar2 = std::unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_>::get(&local_18);
  if (pBVar2 == (pointer)0x0) {
    local_a8 = (SslTcpSocketImpl *)0x0;
  }
  else {
    local_a8 = (SslTcpSocketImpl *)
               __dynamic_cast(pBVar2,&BaseSocket::typeinfo,&SslTcpSocket::typeinfo,0);
  }
  pSslTcpSocketImpl = local_a8;
  pBVar3 = BaseSocket::GetImpl((BaseSocket *)local_a8);
  if (pBVar3 == (BaseSocketImpl *)0x0) {
    local_b8 = (SslTcpSocketImpl *)0x0;
  }
  else {
    local_b8 = (SslTcpSocketImpl *)__dynamic_cast(pBVar3,&BaseSocketImpl::typeinfo,&typeinfo,0);
  }
  local_30 = local_b8;
  local_58 = DatenEncode;
  local_50 = 0;
  std::
  bind<int(SslTcpSocketImpl::*)(unsigned_char_const*,unsigned_long),SslTcpSocketImpl*&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_48,(offset_in_SslTcpSocketImpl_to_subr *)&local_58,&local_30,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
  std::function<int(unsigned_char_const*,unsigned_long)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long)> *)
             &(local_30->super_TcpSocketImpl).m_fnSslEncode,&local_48);
  lock._M_device = (mutex_type *)DatenDecode;
  std::
  bind<int(SslTcpSocketImpl::*)(unsigned_char_const*,unsigned_long,bool&),SslTcpSocketImpl*&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
            (&local_80,(offset_in_SslTcpSocketImpl_to_subr *)&lock,&local_30,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
             (_Placeholder<3> *)&std::placeholders::_3);
  std::function<int(unsigned_char_const*,unsigned_long,bool&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,bool&)> *)
             &(local_30->super_TcpSocketImpl).m_fnSslDecode,&local_80);
  std::lock_guard<std::mutex>::lock_guard(&local_98,&BaseSocketImpl::s_mxClientSocket);
  std::
  deque<std::unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_>,_std::allocator<std::unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_>_>_>
  ::push_back(&BaseSocketImpl::s_lstClientSocket,&local_18);
  pSVar1 = pSslTcpSocketImpl;
  std::lock_guard<std::mutex>::~lock_guard(&local_98);
  std::unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_>::~unique_ptr(&local_18);
  return (SslTcpSocket *)pSVar1;
}

Assistant:

SslTcpSocket* SslTcpSocketImpl::SwitchToSsl(TcpSocket* pTcpSocket)
{
    unique_ptr<BaseSocket> pSslTcpSocket = make_unique<SslTcpSocket>(pTcpSocket);
    SslTcpSocket* pSslTcpSock = dynamic_cast<SslTcpSocket*>(pSslTcpSocket.get());
    SslTcpSocketImpl* pSslTcpSocketImpl = dynamic_cast<SslTcpSocketImpl*>(pSslTcpSock->GetImpl());

    pSslTcpSocketImpl->m_fnSslEncode = bind(&SslTcpSocketImpl::DatenEncode, pSslTcpSocketImpl, _1, _2);
    pSslTcpSocketImpl->m_fnSslDecode = bind(&SslTcpSocketImpl::DatenDecode, pSslTcpSocketImpl, _1, _2, _3);

    lock_guard<mutex> lock(s_mxClientSocket);
    s_lstClientSocket.push_back(move(pSslTcpSocket));

    return pSslTcpSock;
}